

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_VD(archive_write *a,vdd *vdd)

{
  uchar *puVar1;
  char *in_RSI;
  archive_write *in_RDI;
  size_t in_stack_00000008;
  char *in_stack_00000010;
  int r;
  uchar fst_ver;
  uchar vd_ver;
  vdc vdc;
  VD_type vdt;
  char identifier [256];
  uint16_t volume_set_size;
  uchar *bp;
  iso9660_conflict *iso9660;
  undefined8 in_stack_fffffffffffffe88;
  uint32_t value;
  size_t *psVar2;
  uchar *in_stack_fffffffffffffe90;
  vdc vdc_00;
  char *bp_00;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  uchar *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int iVar4;
  undefined2 in_stack_fffffffffffffebc;
  uchar uVar5;
  uchar ver;
  undefined4 uVar6;
  VD_type type;
  vdd_type in_stack_fffffffffffffed8;
  dir_rec_type in_stack_fffffffffffffedc;
  iso9660_conflict *in_stack_fffffffffffffee0;
  isoent *in_stack_fffffffffffffee8;
  size_t in_stack_fffffffffffffef0;
  uchar *in_stack_fffffffffffffef8;
  vdd *in_stack_ffffffffffffffa8;
  archive_write *in_stack_ffffffffffffffb0;
  vdc in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  uchar *in_stack_ffffffffffffffc8;
  archive_string *id;
  int leading_under;
  char_type in_stack_fffffffffffffff8;
  int local_4;
  
  id = (archive_string *)in_RDI->format_data;
  iVar4 = *(int *)(in_RSI + 8);
  if (iVar4 != 0) {
    if (iVar4 == 1) {
      type = VDT_SUPPLEMENTARY;
      uVar5 = '\x01';
      ver = '\x01';
      uVar6 = 2;
      goto LAB_002a2ef7;
    }
    if (iVar4 == 2) {
      type = VDT_SUPPLEMENTARY;
      uVar5 = '\x02';
      ver = '\x02';
      uVar6 = 1;
      goto LAB_002a2ef7;
    }
  }
  type = VDT_PRIMARY;
  uVar5 = '\x01';
  ver = '\x01';
  uVar6 = 0;
LAB_002a2ef7:
  puVar1 = wb_buffptr(in_RDI);
  leading_under = (int)in_RDI;
  set_VD_bp(puVar1 + -1,type,ver);
  set_unused_field_bp(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                      (int)in_stack_fffffffffffffe88);
  get_system_identitier(in_stack_00000010,in_stack_00000008);
  local_4 = set_str_a_characters_bp
                      ((archive_write *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                       in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                       ,(char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       (vdc)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  if ((local_4 == 0) &&
     (local_4 = set_str_d_characters_bp
                          ((archive_write *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                           in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                           in_stack_fffffffffffffea0,
                           (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                           (vdc)((ulong)in_stack_fffffffffffffe90 >> 0x20)), local_4 == 0)) {
    set_unused_field_bp(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                        (int)in_stack_fffffffffffffe88);
    set_num_733(in_stack_fffffffffffffe90,(uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20));
    if (*(int *)(in_RSI + 8) == 1) {
      puVar1[0x58] = '%';
      puVar1[0x59] = '/';
      puVar1[0x5a] = 'E';
      memset(puVar1 + 0x5b,0,0x1d);
      value = (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    }
    else {
      set_unused_field_bp(in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                          (int)in_stack_fffffffffffffe88);
      value = (uint32_t)((ulong)in_stack_fffffffffffffe88 >> 0x20);
    }
    set_num_723(in_stack_fffffffffffffe90,(uint16_t)(value >> 0x10));
    set_num_723(in_stack_fffffffffffffe90,(uint16_t)(value >> 0x10));
    set_num_723(in_stack_fffffffffffffe90,(uint16_t)(value >> 0x10));
    set_num_733(in_stack_fffffffffffffe90,value);
    set_num_731(in_stack_fffffffffffffe90,value);
    set_num_731(in_stack_fffffffffffffe90,value);
    set_num_732(in_stack_fffffffffffffe90,value);
    set_num_732(in_stack_fffffffffffffe90,value);
    vdc_00 = (vdc)((ulong)in_stack_fffffffffffffe90 >> 0x20);
    set_directory_record
              (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    local_4 = set_str_d_characters_bp
                        ((archive_write *)CONCAT44(iVar4,in_stack_fffffffffffffeb0),
                         in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                         in_stack_fffffffffffffea0,
                         (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         vdc_00);
    if ((((local_4 == 0) &&
         (local_4 = set_file_identifier(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id,
                                        in_RSI,leading_under,in_stack_fffffffffffffff8),
         local_4 == 0)) &&
        (local_4 = set_file_identifier(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id,in_RSI
                                       ,leading_under,in_stack_fffffffffffffff8), local_4 == 0)) &&
       (((local_4 = set_file_identifier(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id,
                                        in_RSI,leading_under,in_stack_fffffffffffffff8),
         local_4 == 0 &&
         (local_4 = set_file_identifier(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                        in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                        in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id,
                                        in_RSI,leading_under,in_stack_fffffffffffffff8),
         local_4 == 0)) &&
        (local_4 = set_file_identifier(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                       in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                       in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id,in_RSI
                                       ,leading_under,in_stack_fffffffffffffff8), local_4 == 0)))) {
      psVar2 = &id[0x12].length;
      bp_00 = "Bibliongraphic File";
      uVar3 = 0;
      local_4 = set_file_identifier(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                                    in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                    in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,id,in_RSI,
                                    leading_under,in_stack_fffffffffffffff8);
      if (local_4 == 0) {
        set_date_time((uchar *)CONCAT44(type,uVar6),
                      (ulong)CONCAT13(ver,CONCAT12(uVar5,in_stack_fffffffffffffebc)) << 0x20);
        set_date_time((uchar *)CONCAT44(type,uVar6),
                      CONCAT17(ver,CONCAT16(uVar5,CONCAT24(in_stack_fffffffffffffebc,local_4))));
        set_date_time_null((uchar *)0x2a34f4);
        set_date_time((uchar *)CONCAT44(type,uVar6),
                      CONCAT17(ver,CONCAT16(uVar5,CONCAT24(in_stack_fffffffffffffebc,local_4))));
        puVar1[0x371] = uVar5;
        puVar1[0x372] = '\0';
        memset(puVar1 + 0x373,0x20,0x200);
        set_unused_field_bp((uchar *)bp_00,(int)((ulong)psVar2 >> 0x20),(int)psVar2);
        local_4 = wb_consume((archive_write *)CONCAT44(in_stack_fffffffffffffe9c,uVar3),
                             (size_t)bp_00);
      }
    }
  }
  return local_4;
}

Assistant:

static int
write_VD(struct archive_write *a, struct vdd *vdd)
{
	struct iso9660 *iso9660;
	unsigned char *bp;
	uint16_t volume_set_size = 1;
	char identifier[256];
	enum VD_type vdt;
	enum vdc vdc;
	unsigned char vd_ver, fst_ver;
	int r;

	iso9660 = a->format_data;
	switch (vdd->vdd_type) {
	case VDD_JOLIET:
		vdt = VDT_SUPPLEMENTARY;
		vd_ver = fst_ver = 1;
		vdc = VDC_UCS2;
		break;
	case VDD_ENHANCED:
		vdt = VDT_SUPPLEMENTARY;
		vd_ver = fst_ver = 2;
		vdc = VDC_LOWERCASE;
		break;
	case VDD_PRIMARY:
	default:
		vdt = VDT_PRIMARY;
		vd_ver = fst_ver = 1;
#ifdef COMPAT_MKISOFS
		vdc = VDC_LOWERCASE;
#else
		vdc = VDC_STD;
#endif
		break;
	}

	bp = wb_buffptr(a) -1;
	/* Volume Descriptor Type */
	set_VD_bp(bp, vdt, vd_ver);
	/* Unused Field */
	set_unused_field_bp(bp, 8, 8);
	/* System Identifier */
	get_system_identitier(identifier, sizeof(identifier));
	r = set_str_a_characters_bp(a, bp, 9, 40, identifier, vdc);
	if (r != ARCHIVE_OK)
		return (r);
	/* Volume Identifier */
	r = set_str_d_characters_bp(a, bp, 41, 72,
	    iso9660->volume_identifier.s, vdc);
	if (r != ARCHIVE_OK)
		return (r);
	/* Unused Field */
	set_unused_field_bp(bp, 73, 80);
	/* Volume Space Size */
	set_num_733(bp+81, iso9660->volume_space_size);
	if (vdd->vdd_type == VDD_JOLIET) {
		/* Escape Sequences */
		bp[89] = 0x25;/* UCS-2 Level 3 */
		bp[90] = 0x2F;
		bp[91] = 0x45;
		memset(bp + 92, 0, 120 - 92 + 1);
	} else {
		/* Unused Field */
		set_unused_field_bp(bp, 89, 120);
	}
	/* Volume Set Size */
	set_num_723(bp+121, volume_set_size);
	/* Volume Sequence Number */
	set_num_723(bp+125, iso9660->volume_sequence_number);
	/* Logical Block Size */
	set_num_723(bp+129, LOGICAL_BLOCK_SIZE);
	/* Path Table Size */
	set_num_733(bp+133, vdd->path_table_size);
	/* Location of Occurrence of Type L Path Table */
	set_num_731(bp+141, vdd->location_type_L_path_table);
	/* Location of Optional Occurrence of Type L Path Table */
	set_num_731(bp+145, 0);
	/* Location of Occurrence of Type M Path Table */
	set_num_732(bp+149, vdd->location_type_M_path_table);
	/* Location of Optional Occurrence of Type M Path Table */
	set_num_732(bp+153, 0);
	/* Directory Record for Root Directory(BP 157 to 190) */
	set_directory_record(bp+157, 190-157+1, vdd->rootent,
	    iso9660, DIR_REC_VD, vdd->vdd_type);
	/* Volume Set Identifier */
	r = set_str_d_characters_bp(a, bp, 191, 318, "", vdc);
	if (r != ARCHIVE_OK)
		return (r);
	/* Publisher Identifier */
	r = set_file_identifier(bp, 319, 446, vdc, a, vdd,
	    &(iso9660->publisher_identifier),
	    "Publisher File", 1, A_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Data Preparer Identifier */
	r = set_file_identifier(bp, 447, 574, vdc, a, vdd,
	    &(iso9660->data_preparer_identifier),
	    "Data Preparer File", 1, A_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Application Identifier */
	r = set_file_identifier(bp, 575, 702, vdc, a, vdd,
	    &(iso9660->application_identifier),
	    "Application File", 1, A_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Copyright File Identifier */
	r = set_file_identifier(bp, 703, 739, vdc, a, vdd,
	    &(iso9660->copyright_file_identifier),
	    "Copyright File", 0, D_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Abstract File Identifier */
	r = set_file_identifier(bp, 740, 776, vdc, a, vdd,
	    &(iso9660->abstract_file_identifier),
	    "Abstract File", 0, D_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Bibliongraphic File Identifier */
	r = set_file_identifier(bp, 777, 813, vdc, a, vdd,
	    &(iso9660->bibliographic_file_identifier),
	    "Bibliongraphic File", 0, D_CHAR);
	if (r != ARCHIVE_OK)
		return (r);
	/* Volume Creation Date and Time */
	set_date_time(bp+814, iso9660->birth_time);
	/* Volume Modification Date and Time */
	set_date_time(bp+831, iso9660->birth_time);
	/* Volume Expiration Date and Time(obsolete) */
	set_date_time_null(bp+848);
	/* Volume Effective Date and Time */
	set_date_time(bp+865, iso9660->birth_time);
	/* File Structure Version */
	bp[882] = fst_ver;
	/* Reserved */
	bp[883] = 0;
	/* Application Use */
	memset(bp + 884, 0x20, 1395 - 884 + 1);
	/* Reserved */
	set_unused_field_bp(bp, 1396, LOGICAL_BLOCK_SIZE);

	return (wb_consume(a, LOGICAL_BLOCK_SIZE));
}